

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O0

status_t __thiscall zmq::null_mechanism_t::status(null_mechanism_t *this)

{
  byte local_23;
  byte local_22;
  byte local_21;
  bool command_received;
  bool command_sent;
  null_mechanism_t *this_local;
  status_t local_4;
  
  if ((((this->super_zap_client_t).field_0x48 & 1) == 0) ||
     (((this->super_zap_client_t).field_0x4a & 1) == 0)) {
    local_21 = 1;
    if (((this->super_zap_client_t).field_0x48 & 1) == 0) {
      local_21 = (this->super_zap_client_t).field_0x49;
    }
    local_22 = 1;
    if (((this->super_zap_client_t).field_0x4a & 1) == 0) {
      local_22 = (this->super_zap_client_t).field_0x4b;
    }
    local_23 = 0;
    if ((local_21 & 1) != 0) {
      local_23 = local_22 & 1;
    }
    local_4 = handshaking;
    if (local_23 != 0) {
      local_4 = error;
    }
  }
  else {
    local_4 = ready;
  }
  return local_4;
}

Assistant:

zmq::mechanism_t::status_t zmq::null_mechanism_t::status () const
{
    if (_ready_command_sent && _ready_command_received)
        return ready;

    const bool command_sent = _ready_command_sent || _error_command_sent;
    const bool command_received =
      _ready_command_received || _error_command_received;
    return command_sent && command_received ? error : handshaking;
}